

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::benchmarkStarting(XmlReporter *this,BenchmarkInfo *info)

{
  XmlWriter *pXVar1;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef text;
  
  name.m_size = 7;
  name.m_start = "samples";
  pXVar1 = XmlWriter::writeAttribute<unsigned_int,void>(&this->m_xml,name,&info->samples);
  name_00.m_size = 9;
  name_00.m_start = "resamples";
  pXVar1 = XmlWriter::writeAttribute<unsigned_int,void>(pXVar1,name_00,&info->resamples);
  name_01.m_size = 10;
  name_01.m_start = "iterations";
  pXVar1 = XmlWriter::writeAttribute<int,void>(pXVar1,name_01,&info->iterations);
  name_02.m_size = 0xf;
  name_02.m_start = "clockResolution";
  pXVar1 = XmlWriter::writeAttribute<double,void>(pXVar1,name_02,&info->clockResolution);
  name_03.m_size = 0x11;
  name_03.m_start = "estimatedDuration";
  pXVar1 = XmlWriter::writeAttribute<double,void>(pXVar1,name_03,&info->estimatedDuration);
  text.m_size = 0x1a;
  text.m_start = "All values in nano seconds";
  XmlWriter::writeComment(pXVar1,text,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::benchmarkStarting(BenchmarkInfo const &info) {
        m_xml.writeAttribute("samples"_sr, info.samples)
            .writeAttribute("resamples"_sr, info.resamples)
            .writeAttribute("iterations"_sr, info.iterations)
            .writeAttribute("clockResolution"_sr, info.clockResolution)
            .writeAttribute("estimatedDuration"_sr, info.estimatedDuration)
            .writeComment("All values in nano seconds"_sr);
    }